

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

void __thiscall QMenuBar::keyPressEvent(QMenuBar *this,QKeyEvent *e)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  QMenuBarPrivate *this_00;
  Data *pDVar4;
  QArrayData *pQVar5;
  ushort *puVar6;
  QRect *pQVar7;
  QAction *pQVar8;
  char cVar9;
  short sVar10;
  LayoutDirection LVar11;
  int iVar12;
  int iVar13;
  QStyle *pQVar14;
  long lVar15;
  ulong uVar16;
  qsizetype qVar17;
  QAction *pQVar18;
  ulong uVar19;
  QObject *pQVar20;
  long lVar21;
  QObject *pQVar22;
  QAction *pQVar23;
  long in_FS_OFFSET;
  bool bVar24;
  undefined1 auVar25 [16];
  int iVar26;
  QAction *local_90;
  short local_84;
  QAction *local_80;
  QAction *local_78;
  QArrayData *local_68;
  storage_type_conflict *psStack_60;
  undefined1 *local_58;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
  QMenuBarPrivate::updateGeometries(this_00);
  iVar13 = *(int *)(e + 0x40);
  LVar11 = QWidget::layoutDirection(&this->super_QWidget);
  if (LVar11 == RightToLeft) {
    iVar12 = 1;
    if (iVar13 < 0x1000012) {
      if (iVar13 < 0x1000004) {
        if (iVar13 == 0x20) goto switchD_004662e9_caseD_1000013;
LAB_004662b7:
        iVar12 = 1;
        if (iVar13 == 0x1000001) goto switchD_004662e9_caseD_1000012;
        if (iVar13 == 0x1000002) goto switchD_004662e9_caseD_1000014;
      }
      else {
LAB_004663a1:
        if (iVar13 + 0xfefffffcU < 2) goto switchD_004662e9_caseD_1000013;
      }
switchD_004662e9_default:
      cVar9 = QKeyEvent::matches((StandardKey)e);
      if (cVar9 == '\0') {
        iVar13 = QKeyEvent::modifiers();
        if ((iVar13 == 0) || (uVar16 = QKeyEvent::modifiers(), (uVar16 & 0x18000000) != 0)) {
          pQVar5 = *(QArrayData **)(e + 0x28);
          lVar15 = *(long *)(e + 0x38);
          if (pQVar5 != (QArrayData *)0x0) {
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (lVar15 == 1) {
            bVar24 = (this_00->field_0x2a0 & 1) == 0;
          }
          else {
            bVar24 = false;
          }
          if (pQVar5 != (QArrayData *)0x0) {
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar5,2,0x10);
            }
          }
          if (bVar24) {
            pQVar5 = *(QArrayData **)(e + 0x28);
            puVar6 = *(ushort **)(e + 0x30);
            if (pQVar5 == (QArrayData *)0x0) {
              local_84 = QChar::toUpper((uint)*puVar6);
            }
            else {
              LOCK();
              (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              local_84 = QChar::toUpper((uint)*puVar6);
              LOCK();
              (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar5,2,0x10);
              }
            }
            uVar16 = (this_00->super_QWidgetPrivate).actions.d.size;
            iVar12 = 0;
            if (uVar16 == 0) goto LAB_00466766;
            lVar15 = 8;
            uVar19 = 0;
            local_78 = (QAction *)0x0;
            local_80 = (QAction *)0x0;
            local_90 = (QAction *)0x0;
            do {
              pQVar7 = (this_00->actionRects).d.ptr;
              uVar2 = *(undefined8 *)((long)pQVar7 + lVar15 + -8);
              uVar3 = *(undefined8 *)((long)&(pQVar7->x1).m_i + lVar15);
              iVar13 = -(uint)((int)uVar3 == (int)uVar2 + -1);
              iVar26 = -(uint)((int)((ulong)uVar3 >> 0x20) == (int)((ulong)uVar2 >> 0x20) + -1);
              auVar25._4_4_ = iVar13;
              auVar25._0_4_ = iVar13;
              auVar25._8_4_ = iVar26;
              auVar25._12_4_ = iVar26;
              iVar13 = movmskpd((int)pQVar7,auVar25);
              if (iVar13 != 3) {
                pQVar23 = (this_00->super_QWidgetPrivate).actions.d.ptr[uVar19];
                local_58 = &DAT_aaaaaaaaaaaaaaaa;
                local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
                psStack_60 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
                QAction::text();
                pQVar8 = local_80;
                if (local_58 != (undefined1 *)0x0) {
                  local_48.m_size = (qsizetype)local_58;
                  local_48.m_data = psStack_60;
                  qVar17 = QStringView::indexOf(&local_48,(QChar)0x26,0,CaseSensitive);
                  if (-1 < qVar17) {
                    if ((local_68 == (QArrayData *)0x0) ||
                       (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i)) {
                      QString::reallocData((longlong)&local_68,(AllocationOption)local_58);
                    }
                    sVar10 = QChar::toUpper((uint)(ushort)psStack_60[qVar17 + 1]);
                    if (sVar10 == local_84) {
                      if (local_90 == (QAction *)0x0) {
                        local_90 = pQVar23;
                      }
                      pDVar4 = (this_00->currentAction).wp.d;
                      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
                        pQVar18 = (QAction *)0x0;
                      }
                      else {
                        pQVar18 = (QAction *)(this_00->currentAction).wp.value;
                      }
                      iVar12 = iVar12 + 1;
                      pQVar8 = pQVar23;
                      if (pQVar18 != pQVar23) {
                        if (local_80 == (QAction *)0x0) {
                          pQVar23 = local_78;
                        }
                        pQVar8 = local_80;
                        if (local_78 == (QAction *)0x0) {
                          local_78 = pQVar23;
                        }
                      }
                    }
                  }
                }
                local_80 = pQVar8;
                if (local_68 != (QArrayData *)0x0) {
                  LOCK();
                  (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_68,2,0x10);
                  }
                }
                uVar16 = (this_00->super_QWidgetPrivate).actions.d.size;
              }
              uVar19 = uVar19 + 1;
              lVar15 = lVar15 + 0x10;
            } while (uVar19 < uVar16);
            if (0 < iVar12) {
              if ((((iVar12 != 1) && (pDVar4 = (this_00->currentAction).wp.d, pDVar4 != (Data *)0x0)
                   ) && (*(int *)(pDVar4 + 4) != 0)) &&
                 ((this_00->currentAction).wp.value != (QObject *)0x0)) {
                if (local_78 != (QAction *)0x0) {
                  local_90 = local_78;
                }
                if (local_80 == (QAction *)0x0) {
                  local_90 = local_78;
                }
              }
              if (local_90 != (QAction *)0x0) {
                bVar24 = true;
                goto LAB_00466754;
              }
            }
          }
        }
        iVar12 = 0;
        goto LAB_00466766;
      }
      QMenuBarPrivate::setCurrentAction(this_00,(QAction *)0x0,false,false);
      QMenuBarPrivate::setKeyboardMode(this_00,false);
    }
    else {
      switch(iVar13) {
      case 0x1000012:
        break;
      case 0x1000013:
      case 0x1000015:
        goto switchD_004662e9_caseD_1000013;
      case 0x1000014:
switchD_004662e9_caseD_1000014:
        iVar12 = -1;
        break;
      default:
        goto switchD_004662e9_default;
      }
switchD_004662e9_caseD_1000012:
      pDVar4 = (this_00->currentAction).wp.d;
      if (((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) ||
         (pQVar20 = (this_00->currentAction).wp.value, pQVar20 == (QObject *)0x0))
      goto switchD_004662e9_default;
      lVar15 = (this_00->super_QWidgetPrivate).actions.d.size;
      if (lVar15 == 0) {
LAB_00466444:
        iVar13 = -1;
      }
      else {
        iVar13 = -1;
        lVar21 = 0;
        do {
          if (lVar15 << 3 == lVar21) goto LAB_00466444;
          pQVar22 = pQVar20;
          if (*(int *)(pDVar4 + 4) == 0) {
            pQVar22 = (QObject *)0x0;
          }
          iVar13 = iVar13 + 1;
          puVar1 = (undefined8 *)((long)(this_00->super_QWidgetPrivate).actions.d.ptr + lVar21);
          lVar21 = lVar21 + 8;
        } while (pQVar22 != (QObject *)*puVar1);
      }
      local_90 = QMenuBarPrivate::getNextAction(this_00,iVar13,iVar12);
      if (local_90 == (QAction *)0x0) goto switchD_004662e9_default;
      bVar24 = (bool)(this_00->field_0x2a0 & 1);
LAB_00466754:
      QMenuBarPrivate::setCurrentAction(this_00,local_90,bVar24,true);
    }
  }
  else {
    if (0x1000011 < iVar13) {
      switch(iVar13) {
      case 0x1000012:
      case 0x1000014:
        iVar12 = (uint)(iVar13 != 0x1000012) * 2 + -1;
        goto switchD_004662e9_caseD_1000012;
      case 0x1000013:
      case 0x1000015:
        goto switchD_004662e9_caseD_1000013;
      default:
        goto switchD_004662e9_default;
      }
    }
    if (0x1000003 < iVar13) goto LAB_004663a1;
    if (iVar13 != 0x20) goto LAB_004662b7;
switchD_004662e9_caseD_1000013:
    pQVar14 = QWidget::style(&this->super_QWidget);
    iVar12 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,0x12,0,this,0);
    if ((((iVar12 == 0) || (pDVar4 = (this_00->currentAction).wp.d, pDVar4 == (Data *)0x0)) ||
        (*(int *)(pDVar4 + 4) == 0)) || ((this_00->currentAction).wp.value == (QObject *)0x0))
    goto switchD_004662e9_default;
    QAction::menuObject();
    lVar15 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar15 == 0) {
      iVar12 = 1;
      if ((iVar13 + 0xfefffffcU < 2) || (iVar13 == 0x20)) {
        pDVar4 = (this_00->currentAction).wp.d;
        if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
          pQVar20 = (QObject *)0x0;
        }
        else {
          pQVar20 = (this_00->currentAction).wp.value;
        }
        pQVar22 = (QObject *)0x0;
        QMenuBarPrivate::activateAction(this_00,(QAction *)pQVar20,Trigger);
        pDVar4 = (this_00->currentAction).wp.d;
        if (pDVar4 != (Data *)0x0) {
          if (*(int *)(pDVar4 + 4) == 0) {
            pQVar22 = (QObject *)0x0;
          }
          else {
            pQVar22 = (this_00->currentAction).wp.value;
          }
        }
        QMenuBarPrivate::setCurrentAction(this_00,(QAction *)pQVar22,false,false);
        QMenuBarPrivate::setKeyboardMode(this_00,false);
      }
      goto LAB_00466766;
    }
    pDVar4 = (this_00->currentAction).wp.d;
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      pQVar20 = (QObject *)0x0;
    }
    else {
      pQVar20 = (this_00->currentAction).wp.value;
    }
    QMenuBarPrivate::popupAction(this_00,(QAction *)pQVar20,true);
  }
  iVar12 = 1;
LAB_00466766:
  e[0xc] = SUB41(iVar12,0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBar::keyPressEvent(QKeyEvent *e)
{
    Q_D(QMenuBar);
    d->updateGeometries();
    int key = e->key();
    if (isRightToLeft()) {  // in reverse mode open/close key for submenues are reversed
        if (key == Qt::Key_Left)
            key = Qt::Key_Right;
        else if (key == Qt::Key_Right)
            key = Qt::Key_Left;
    }
    if (key == Qt::Key_Tab) //means right
        key = Qt::Key_Right;
    else if (key == Qt::Key_Backtab) //means left
        key = Qt::Key_Left;

    bool key_consumed = false;
    switch(key) {
    case Qt::Key_Up:
    case Qt::Key_Down:
    case Qt::Key_Enter:
    case Qt::Key_Space:
    case Qt::Key_Return: {
        if (!style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, this) || !d->currentAction)
           break;
        if (d->currentAction->menu()) {
            d->popupAction(d->currentAction, true);
        } else if (key == Qt::Key_Enter || key == Qt::Key_Return || key == Qt::Key_Space) {
            d->activateAction(d->currentAction, QAction::Trigger);
            d->setCurrentAction(d->currentAction, false);
            d->setKeyboardMode(false);
        }
        key_consumed = true;
        break; }

    case Qt::Key_Right:
    case Qt::Key_Left: {
        if (d->currentAction) {
            int index = d->actions.indexOf(d->currentAction);
            if (QAction *nextAction = d->getNextAction(index, key == Qt::Key_Left ? -1 : +1)) {
                d->setCurrentAction(nextAction, d->popupState, true);
                key_consumed = true;
            }
        }
        break; }

    default:
        key_consumed = false;
    }

#ifndef QT_NO_SHORTCUT
    if (!key_consumed && e->matches(QKeySequence::Cancel)) {
        d->setCurrentAction(nullptr);
        d->setKeyboardMode(false);
        key_consumed = true;
    }
#endif

    if (!key_consumed &&
       (!e->modifiers() ||
        (e->modifiers()&(Qt::MetaModifier|Qt::AltModifier))) && e->text().size()==1 && !d->popupState) {
        int clashCount = 0;
        QAction *first = nullptr, *currentSelected = nullptr, *firstAfterCurrent = nullptr;
        {
            const QChar c = e->text().at(0).toUpper();
            for(int i = 0; i < d->actions.size(); ++i) {
                if (d->actionRects.at(i).isNull())
                    continue;
                QAction *act = d->actions.at(i);
                QString s = act->text();
                if (!s.isEmpty()) {
                    qsizetype ampersand = s.indexOf(u'&');
                    if (ampersand >= 0) {
                        if (s[ampersand+1].toUpper() == c) {
                            clashCount++;
                            if (!first)
                                first = act;
                            if (act == d->currentAction)
                                currentSelected = act;
                            else if (!firstAfterCurrent && currentSelected)
                                firstAfterCurrent = act;
                        }
                    }
                }
            }
        }
        QAction *next_action = nullptr;
        if (clashCount >= 1) {
            if (clashCount == 1 || !d->currentAction || (currentSelected && !firstAfterCurrent))
                next_action = first;
            else
                next_action = firstAfterCurrent;
        }
        if (next_action) {
            key_consumed = true;
            d->setCurrentAction(next_action, true, true);
        }
    }
    if (key_consumed)
        e->accept();
    else
        e->ignore();
}